

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general_attr.cpp
# Opt level: O2

void testAttrChlists(string *tempdir)

{
  exr_context_t f_00;
  exr_context_t f;
  
  f_00 = createDummyFile("<chlist>");
  f = f_00;
  testChlistHelper(f_00);
  exr_print_context_info(f_00,0);
  exr_print_context_info(f_00,1);
  exr_finish(&f);
  return;
}

Assistant:

void
testAttrChlists (const std::string& tempdir)
{
    // we no longer allow a null context as we need the memory allocator
    //testChlistHelper (NULL);
    exr_context_t f = createDummyFile ("<chlist>");
    testChlistHelper (f);
    exr_print_context_info (f, 0);
    exr_print_context_info (f, 1);
    exr_finish (&f);
}